

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void * base_alloc_impl(tsdn_t *tsdn,base_t *base,size_t size,size_t alignment,size_t *esn,
                      size_t *ret_usize)

{
  uint uVar1;
  ulong alignment_00;
  base_t *base_00;
  edata_t *edata_00;
  uint64_t uVar2;
  long in_RCX;
  size_t in_RDX;
  base_t *in_RSI;
  tsdn_t *in_RDI;
  uint64_t *in_R8;
  tsdn_t *in_R9;
  void *ret;
  szind_t i;
  edata_t *edata;
  size_t asize;
  size_t usize;
  szind_t ret_1;
  void *local_78;
  undefined4 in_stack_ffffffffffffff90;
  edata_t *edata_01;
  
  alignment_00 = in_RCX + 0xfU & 0xfffffffffffffff0;
  base_00 = (base_t *)(in_RDX + (alignment_00 - 1) & (alignment_00 ^ 0xffffffffffffffff) + 1);
  edata_00 = (edata_t *)((long)base_00 + (alignment_00 - 0x10));
  edata_01 = (edata_t *)0x0;
  malloc_mutex_lock((tsdn_t *)base_00,(malloc_mutex_t *)edata_00);
  if (edata_00 < (edata_t *)0x1001) {
    uVar1 = (uint)duckdb_je_sz_size2index_tab[(ulong)((long)&edata_00->e_bits + 7) >> 3];
  }
  else {
    uVar1 = sz_size2index_compute((size_t)in_R8);
  }
  while ((uVar1 < 0xe8 &&
         (edata_01 = duckdb_je_edata_heap_remove_first((edata_heap_t *)0x24c8e91),
         edata_01 == (edata_t *)0x0))) {
    uVar1 = uVar1 + 1;
  }
  if (edata_01 == (edata_t *)0x0) {
    edata_01 = base_extent_alloc(in_RDI,in_RSI,in_RDX,alignment_00);
  }
  if (edata_01 == (edata_t *)0x0) {
    local_78 = (void *)0x0;
  }
  else {
    local_78 = base_extent_bump_alloc
                         (in_R9,base_00,edata_00,(size_t)edata_01,
                          CONCAT44(uVar1,in_stack_ffffffffffffff90));
    if (in_R8 != (uint64_t *)0x0) {
      uVar2 = edata_sn_get(edata_01);
      *in_R8 = uVar2;
    }
    if (in_R9 != (tsdn_t *)0x0) {
      *(base_t **)&in_R9->tsd = base_00;
    }
  }
  malloc_mutex_unlock((tsdn_t *)edata_00,(malloc_mutex_t *)edata_01);
  return local_78;
}

Assistant:

static void *
base_alloc_impl(tsdn_t *tsdn, base_t *base, size_t size, size_t alignment,
    size_t *esn, size_t *ret_usize) {
	alignment = QUANTUM_CEILING(alignment);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t asize = usize + alignment - QUANTUM;

	edata_t *edata = NULL;
	malloc_mutex_lock(tsdn, &base->mtx);
	for (szind_t i = sz_size2index(asize); i < SC_NSIZES; i++) {
		edata = edata_heap_remove_first(&base->avail[i]);
		if (edata != NULL) {
			/* Use existing space. */
			break;
		}
	}
	if (edata == NULL) {
		/* Try to allocate more space. */
		edata = base_extent_alloc(tsdn, base, usize, alignment);
	}
	void *ret;
	if (edata == NULL) {
		ret = NULL;
		goto label_return;
	}

	ret = base_extent_bump_alloc(tsdn, base, edata, usize, alignment);
	if (esn != NULL) {
		*esn = (size_t)edata_sn_get(edata);
	}
	if (ret_usize != NULL) {
		*ret_usize = usize;
	}
label_return:
	malloc_mutex_unlock(tsdn, &base->mtx);
	return ret;
}